

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

void nn_timer_term(nn_timer *self)

{
  nn_timer *self_local;
  
  if (self->state != 1) {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)self->state,
            "NN_TIMER_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/aio/timer.c"
            ,0x3e);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_fsm_event_term(&self->done);
  nn_worker_timer_term(&self->wtimer);
  nn_worker_task_term(&self->stop_task);
  nn_worker_task_term(&self->start_task);
  nn_fsm_term(&self->fsm);
  return;
}

Assistant:

void nn_timer_term (struct nn_timer *self)
{
    nn_assert_state (self, NN_TIMER_STATE_IDLE);

    nn_fsm_event_term (&self->done);
    nn_worker_timer_term (&self->wtimer);
    nn_worker_task_term (&self->stop_task);
    nn_worker_task_term (&self->start_task);
    nn_fsm_term (&self->fsm);
}